

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char *__s;
  string disp_win_name;
  string param_win_name;
  Mat raw_imgl;
  Mat disp_img;
  VideoCapture vcapture;
  string file_name;
  Mat small_img;
  Mat raw_img;
  Mat rect_imgl;
  Mat rect_imgr;
  Mat raw_imgr;
  char win_name [256];
  _InputArray local_4d8;
  long *local_4c0 [2];
  long local_4b0 [2];
  long *local_4a0 [2];
  long local_490 [2];
  long *local_480 [2];
  long local_470 [10];
  _InputArray local_420;
  _InputArray local_408;
  Size *local_3f0;
  Mat *local_3e8;
  Size local_3e0 [10];
  undefined8 local_390;
  string local_388;
  VideoCapture local_368 [48];
  long *local_338;
  long local_330;
  long local_328 [2];
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  Mat local_2b8 [96];
  _InputArray local_258 [4];
  _InputArray local_1f8 [4];
  Mat local_198 [96];
  allocator<char> local_138 [264];
  
  if (argc == 2) {
    __s = argv[1];
  }
  else {
    __s = "../astar_calicam.yml";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,__s,local_138);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_388,local_338,local_330 + (long)local_338);
  LoadParameters(&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  InitRectifyMap();
  cv::Mat::Mat(local_2b8);
  cv::VideoCapture::VideoCapture(local_368);
  if (live == true) {
    cv::VideoCapture::open((int)local_368,0);
    cVar1 = cv::VideoCapture::isOpened();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Camera doesn\'t work",0x13);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_00106ace;
    }
    cv::VideoCapture::set((int)local_368,(double)cap_cols);
    cv::VideoCapture::set((int)local_368,(double)cap_rows);
    cv::VideoCapture::set((int)local_368,30.0);
  }
  else {
    local_480[0] = local_470;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"../dasl_wood_shop.jpg","");
    cv::imread((string *)local_138,(int)local_480);
    cv::Mat::operator=(local_2b8,(Mat *)local_138);
    cv::Mat::~Mat((Mat *)local_138);
    if (local_480[0] != local_470) {
      operator_delete(local_480[0],local_470[0] + 1);
    }
  }
  sprintf((char *)local_138,"Raw Image: %d x %d",(ulong)(uint)img_width,(ulong)(uint)cap_rows);
  local_4a0[0] = local_490;
  sVar4 = strlen((char *)local_138);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,local_138,local_138 + sVar4);
  cv::namedWindow((string *)local_4a0,1);
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"V. FoV:  60    +","");
  cv::createTrackbar((string *)local_480,(string *)local_4a0,(int *)0x0,vfov_max,OnTrackAngle,
                     (void *)0x0);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0],local_470[0] + 1);
  }
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Width:  480 +","");
  cv::createTrackbar((string *)local_480,(string *)local_4a0,(int *)0x0,width_max,OnTrackWidth,
                     (void *)0x0);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0],local_470[0] + 1);
  }
  local_480[0] = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Height: 360 +","");
  cv::createTrackbar((string *)local_480,(string *)local_4a0,(int *)0x0,height_max,OnTrackHeight,
                     (void *)0x0);
  if (local_480[0] != local_470) {
    operator_delete(local_480[0],local_470[0] + 1);
  }
  local_4c0[0] = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"Disparity Image","");
  iVar3 = std::__cxx11::string::compare((char *)&cam_model_abi_cxx11_);
  if (iVar3 == 0) {
    cv::namedWindow((string *)local_4c0,1);
    local_480[0] = local_470;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Num Disp:  16 + 16 *","");
    cv::createTrackbar((string *)local_480,(string *)local_4c0,(int *)0x0,ndisp_max,OnTrackNdisp,
                       (void *)0x0);
    if (local_480[0] != local_470) {
      operator_delete(local_480[0],local_470[0] + 1);
    }
    local_480[0] = local_470;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Num Disp:  16 + 16 *","");
    cv::setTrackbarPos((string *)local_480,(string *)local_4c0,ndisp_bar);
    if (local_480[0] != local_470) {
      operator_delete(local_480[0],local_470[0] + 1);
    }
    local_480[0] = local_470;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_480,"Blk   Size :     3  +  2 *","");
    cv::createTrackbar((string *)local_480,(string *)local_4c0,(int *)0x0,wsize_max,OnTrackWsize,
                       (void *)0x0);
    if (local_480[0] != local_470) {
      operator_delete(local_480[0],local_470[0] + 1);
    }
    local_480[0] = local_470;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_480,"Blk   Size :     3  +  2 *","");
    cv::setTrackbarPos((string *)local_480,(string *)local_4c0,wsize_bar);
    if (local_480[0] != local_470) {
      operator_delete(local_480[0],local_470[0] + 1);
    }
  }
  cv::Mat::Mat((Mat *)local_480);
  cv::Mat::Mat(local_198);
  cv::Mat::Mat((Mat *)local_258);
  cv::Mat::Mat((Mat *)local_1f8);
  while( true ) {
    if (changed == true) {
      InitRectifyMap();
      changed = false;
    }
    if (live == true) {
      cv::VideoCapture::operator>>(local_368,local_2b8);
    }
    lVar5 = cv::Mat::total();
    if (lVar5 == 0) break;
    iVar3 = std::__cxx11::string::compare((char *)&cam_model_abi_cxx11_);
    if (iVar3 == 0) {
      local_4d8.flags = 0;
      local_4d8._4_4_ = 0;
      local_4d8.obj = (void *)CONCAT44(cap_rows,img_width);
      cv::Mat::Mat((Mat *)&local_318,local_2b8,(Rect_ *)&local_4d8);
      local_3e0[0].width = 0;
      local_3e0[0].height = 0;
      local_3f0._0_4_ = 0x2010000;
      local_3e8 = (Mat *)local_480;
      cv::Mat::copyTo((_OutputArray *)&local_318);
      cv::Mat::~Mat((Mat *)&local_318);
      local_4d8._4_4_ = 0;
      local_4d8.flags = img_width;
      local_4d8.obj = (void *)CONCAT44(cap_rows,img_width);
      cv::Mat::Mat((Mat *)&local_318,local_2b8,(Rect_ *)&local_4d8);
      local_3e0[0].width = 0;
      local_3e0[0].height = 0;
      local_3f0._0_4_ = 0x2010000;
      local_3e8 = local_198;
      cv::Mat::copyTo((_OutputArray *)&local_318);
      cv::Mat::~Mat((Mat *)&local_318);
      local_3e0[0].width = 0;
      local_3e0[0].height = 0;
      local_3f0._0_4_ = 0x1010000;
      local_3e8 = (Mat *)local_480;
      local_4d8.sz.width = 0;
      local_4d8.sz.height = 0;
      local_4d8.flags = 0x2010000;
      local_4d8.obj = local_258;
      local_408.sz.width = 0;
      local_408.sz.height = 0;
      local_408.flags = 0x1010000;
      local_408.obj = smap;
      local_420.sz.width = 0;
      local_420.sz.height = 0;
      local_420.flags = 0x1010000;
      local_420.obj = smap + 0x60;
      local_308 = 0;
      uStack_300 = 0;
      local_318 = 0;
      uStack_310 = 0;
      cv::remap((_InputArray *)&local_3f0,(_OutputArray *)&local_4d8,&local_408,&local_420,1,0,
                (Scalar_ *)&local_318);
      local_3e0[0].width = 0;
      local_3e0[0].height = 0;
      local_3f0 = (Size *)CONCAT44(local_3f0._4_4_,0x1010000);
      local_3e8 = local_198;
      local_4d8.sz.width = 0;
      local_4d8.sz.height = 0;
      local_4d8.flags = 0x2010000;
      local_4d8.obj = local_1f8;
      local_408.sz.width = 0;
      local_408.sz.height = 0;
      local_408.flags = 0x1010000;
      local_408.obj = smap + 0xc0;
      local_420.sz.width = 0;
      local_420.sz.height = 0;
      local_420.flags = 0x1010000;
      local_420.obj = smap + 0x120;
      local_308 = 0;
      uStack_300 = 0;
      local_318 = 0;
      uStack_310 = 0;
      cv::remap((_InputArray *)&local_3f0,(_OutputArray *)&local_4d8,&local_408,&local_420,1,0,
                (Scalar_ *)&local_318);
    }
    else {
      cv::Mat::operator=((Mat *)local_480,local_2b8);
      local_3e0[0].width = 0;
      local_3e0[0].height = 0;
      local_3f0 = (Size *)CONCAT44(local_3f0._4_4_,0x1010000);
      local_3e8 = local_2b8;
      local_4d8.sz.width = 0;
      local_4d8.sz.height = 0;
      local_4d8.flags = 0x2010000;
      local_4d8.obj = local_258;
      local_408.sz.width = 0;
      local_408.sz.height = 0;
      local_408.flags = 0x1010000;
      local_408.obj = smap;
      local_420.sz.width = 0;
      local_420.sz.height = 0;
      local_420.flags = 0x1010000;
      local_420.obj = smap + 0x60;
      local_308 = 0;
      uStack_300 = 0;
      local_318 = 0;
      uStack_310 = 0;
      cv::remap((_InputArray *)&local_3f0,(_OutputArray *)&local_4d8,&local_408,&local_420,1,0,
                (Scalar_ *)&local_318);
    }
    cv::Mat::Mat((Mat *)&local_318);
    local_3e0[0].width = 0;
    local_3e0[0].height = 0;
    local_3f0._0_4_ = 0x1010000;
    local_3e8 = (Mat *)local_480;
    local_4d8.sz.width = 0;
    local_4d8.sz.height = 0;
    local_4d8.flags = 0x2010000;
    local_390 = 0;
    local_4d8.obj = (Mat *)&local_318;
    cv::resize(0,0x3fe0000000000000,(_InputArray *)&local_3f0,&local_4d8,&local_390,1);
    local_3e0[0].width = 0;
    local_3e0[0].height = 0;
    local_3f0 = (Size *)CONCAT44(local_3f0._4_4_,0x1010000);
    local_3e8 = (Mat *)&local_318;
    cv::imshow((string *)local_4a0,(_InputArray *)&local_3f0);
    local_3f0 = local_3e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Rectified Image","");
    local_4d8.sz.width = 0;
    local_4d8.sz.height = 0;
    local_4d8.flags = 0x1010000;
    local_4d8.obj = local_258;
    cv::imshow((string *)&local_3f0,&local_4d8);
    if (local_3f0 != local_3e0) {
      operator_delete(local_3f0,(long)local_3e0[0] + 1);
    }
    iVar3 = std::__cxx11::string::compare((char *)&cam_model_abi_cxx11_);
    if (iVar3 == 0) {
      cv::Mat::Mat((Mat *)&local_3f0);
      DisparityImage((Mat *)local_258,(Mat *)local_1f8,(Mat *)&local_3f0);
      local_4d8.sz.width = 0;
      local_4d8.sz.height = 0;
      local_4d8.flags = 0x1010000;
      local_4d8.obj = (_InputArray *)&local_3f0;
      cv::imshow((string *)local_4c0,&local_4d8);
      cv::Mat::~Mat((Mat *)&local_3f0);
    }
    bVar2 = cv::waitKey(1);
    cv::Mat::~Mat((Mat *)&local_318);
    if (((bVar2 & 0xdf) == 0x51) || (bVar2 == 0x1b)) {
      cv::Mat::~Mat((Mat *)local_1f8);
      cv::Mat::~Mat((Mat *)local_258);
      cv::Mat::~Mat(local_198);
      cv::Mat::~Mat((Mat *)local_480);
      if (local_4c0[0] != local_4b0) {
        operator_delete(local_4c0[0],local_4b0[0] + 1);
      }
      if (local_4a0[0] != local_490) {
        operator_delete(local_4a0[0],local_490[0] + 1);
      }
      cv::VideoCapture::~VideoCapture(local_368);
      cv::Mat::~Mat(local_2b8);
      if (local_338 != local_328) {
        operator_delete(local_338,local_328[0] + 1);
      }
      return 0;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Image capture error",0x13);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_00106ace:
  exit(-1);
}

Assistant:

int main(int argc, char** argv) {
  std::string file_name = argc == 2 ? argv[1] : "../astar_calicam.yml";
  LoadParameters(file_name);
  InitRectifyMap();

  cv::Mat raw_img;
  cv::VideoCapture vcapture;
  if (live) {
    vcapture.open(0);

    if (!vcapture.isOpened()) {
      std::cout << "Camera doesn't work" << std::endl;
      exit(-1);
    }

    vcapture.set(cv::CAP_PROP_FRAME_WIDTH,  cap_cols);
    vcapture.set(cv::CAP_PROP_FRAME_HEIGHT, cap_rows);
    vcapture.set(cv::CAP_PROP_FPS, 30);
  } else {
    raw_img = cv::imread("../dasl_wood_shop.jpg", cv::IMREAD_COLOR);
  }

  char win_name[256];
  sprintf(win_name, "Raw Image: %d x %d", img_width, cap_rows);
  std::string param_win_name(win_name);
  cv::namedWindow(param_win_name);

  cv::createTrackbar("V. FoV:  60    +", param_win_name, nullptr, vfov_max, OnTrackAngle);
  cv::createTrackbar("Width:  480 +", param_win_name, nullptr, width_max, OnTrackWidth);
  cv::createTrackbar("Height: 360 +", param_win_name, nullptr, height_max, OnTrackHeight);

  std::string disp_win_name  = "Disparity Image";
  if (cam_model == "stereo") {
    cv::namedWindow(disp_win_name);
    cv::createTrackbar("Num Disp:  16 + 16 *", disp_win_name, nullptr, ndisp_max, OnTrackNdisp);
    cv::setTrackbarPos("Num Disp:  16 + 16 *", disp_win_name, ndisp_bar);
    cv::createTrackbar("Blk   Size :     3  +  2 *", disp_win_name, nullptr, wsize_max, OnTrackWsize);
    cv::setTrackbarPos("Blk   Size :     3  +  2 *", disp_win_name, wsize_bar);
  }

  cv::Mat raw_imgl, raw_imgr, rect_imgl, rect_imgr;
  while (1) {
    if (changed) {
      InitRectifyMap();
      changed = false;
    }

    if (live)
      vcapture >> raw_img;

    if (raw_img.total() == 0) {
      std::cout << "Image capture error" << std::endl;
      exit(-1);
    }

    if (cam_model == "stereo") {
      raw_img(cv::Rect(        0, 0, img_width, cap_rows)).copyTo(raw_imgl);
      raw_img(cv::Rect(img_width, 0, img_width, cap_rows)).copyTo(raw_imgr);

      cv::remap(raw_imgl, rect_imgl, smap[0][0], smap[0][1], 1, 0);
      cv::remap(raw_imgr, rect_imgr, smap[1][0], smap[1][1], 1, 0);
    } else {
      raw_imgl = raw_img;
      cv::remap(raw_img, rect_imgl, smap[0][0], smap[0][1], 1, 0);
    }

    cv::Mat small_img;
    cv::resize(raw_imgl, small_img, cv::Size(), 0.5, 0.5);
    imshow(param_win_name, small_img);
    imshow("Rectified Image", rect_imgl);

    if (cam_model == "stereo") {
      cv::Mat disp_img;
      DisparityImage(rect_imgl, rect_imgr, disp_img);
      imshow(disp_win_name,  disp_img);
    }

    char key = cv::waitKey(1);
    if (key == 'q' || key == 'Q' || key == 27)
      break;
  }

  return 0;
}